

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cc
# Opt level: O2

void __thiscall serial::Serial::flush(Serial *this)

{
  ScopedWriteLock wlock;
  ScopedReadLock rlock;
  ScopedWriteLock local_18;
  ScopedReadLock local_10;
  
  local_10.pimpl_ = this->pimpl_;
  SerialImpl::readLock(local_10.pimpl_);
  local_18.pimpl_ = this->pimpl_;
  SerialImpl::writeLock(local_18.pimpl_);
  SerialImpl::flush(this->pimpl_);
  ScopedWriteLock::~ScopedWriteLock(&local_18);
  ScopedReadLock::~ScopedReadLock(&local_10);
  return;
}

Assistant:

void Serial::flush ()
{
  ScopedReadLock rlock(this->pimpl_);
  ScopedWriteLock wlock(this->pimpl_);
  pimpl_->flush ();
}